

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int set_noise_filter(int pi,uint user_gpio,uint steady,uint active)

{
  int iVar1;
  uint active_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &active_local;
  ext[0].size = 4;
  active_local = active;
  iVar1 = pigpio_command_ext(pi,0x62,user_gpio,steady,4,1,ext,1);
  return iVar1;
}

Assistant:

int set_noise_filter(int pi, unsigned user_gpio, unsigned steady, unsigned active)
{
   gpioExtent_t ext[1];
   
   /*
   p1=user_gpio
   p2=steady
   p3=4
   ## extension ##
   unsigned active
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &active;

   return pigpio_command_ext(
      pi, PI_CMD_FN, user_gpio, steady, 4, 1, ext, 1);
}